

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_workgraph.cpp
# Opt level: O0

bool dxil_spv::emit_increment_output_count(Impl *impl,CallInst *inst)

{
  CallInst *pCVar1;
  bool bVar2;
  Id arg;
  Id IVar3;
  Id arg_00;
  Id arg_01;
  Id type_id;
  Value *pVVar4;
  Operation *this;
  HelperCall call;
  Operation *call_op;
  Id alloc_count;
  Id node_index;
  Id atomic_addr;
  Id call_id;
  uint32_t is_per_thread;
  Builder *builder;
  CallInst *inst_local;
  Impl *impl_local;
  
  builder = (Builder *)inst;
  inst_local = (CallInst *)impl;
  _call_id = Converter::Impl::builder(impl);
  atomic_addr = 0;
  bVar2 = get_constant_operand((Instruction *)builder,3,&atomic_addr);
  if (bVar2) {
    pVVar4 = LLVMBC::Instruction::getOperand((Instruction *)builder,1);
    bVar2 = value_is_dx_op_instrinsic(pVVar4,AnnotateNodeHandle);
    if (bVar2) {
      call = GroupIncrementOutputCount;
      if (atomic_addr != 0) {
        call = ThreadIncrementOutputCount;
      }
      arg = SPIRVModule::get_helper_call_id
                      ((SPIRVModule *)(inst_local->super_Instruction).super_Value.tween_id,call,0);
      pCVar1 = inst_local;
      IVar3 = spv::Builder::makeUintType(_call_id,0x40);
      IVar3 = emit_load_node_input_push_parameter((Impl *)pCVar1,NodePayloadOutputAtomicBDA,IVar3);
      pCVar1 = inst_local;
      pVVar4 = LLVMBC::Instruction::getOperand((Instruction *)builder,1);
      arg_00 = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar4,0);
      pCVar1 = inst_local;
      pVVar4 = LLVMBC::Instruction::getOperand((Instruction *)builder,2);
      arg_01 = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar4,0);
      pCVar1 = inst_local;
      type_id = spv::Builder::makeVoidType(_call_id);
      this = Converter::Impl::allocate((Impl *)pCVar1,OpFunctionCall,type_id);
      Operation::add_id(this,arg);
      Operation::add_id(this,IVar3);
      Operation::add_id(this,arg_00);
      Operation::add_id(this,arg_01);
      Converter::Impl::add((Impl *)inst_local,this,false);
      impl_local._7_1_ = true;
    }
    else {
      impl_local._7_1_ = false;
    }
  }
  else {
    impl_local._7_1_ = false;
  }
  return impl_local._7_1_;
}

Assistant:

bool emit_increment_output_count(Converter::Impl &impl, const llvm::CallInst *inst)
{
	auto &builder = impl.builder();

	uint32_t is_per_thread = 0;
	if (!get_constant_operand(inst, 3, &is_per_thread))
		return false;

	if (!value_is_dx_op_instrinsic(inst->getOperand(1), DXIL::Op::AnnotateNodeHandle))
		return false;

	spv::Id call_id = impl.spirv_module.get_helper_call_id(
	    is_per_thread ? HelperCall::ThreadIncrementOutputCount : HelperCall::GroupIncrementOutputCount);

	spv::Id atomic_addr = emit_load_node_input_push_parameter(impl, NodePayloadOutputAtomicBDA, builder.makeUintType(64));
	spv::Id node_index = impl.get_id_for_value(inst->getOperand(1));
	spv::Id alloc_count = impl.get_id_for_value(inst->getOperand(2));

	auto *call_op = impl.allocate(spv::OpFunctionCall, builder.makeVoidType());
	call_op->add_id(call_id);
	call_op->add_id(atomic_addr);
	call_op->add_id(node_index);
	call_op->add_id(alloc_count);
	impl.add(call_op);

	return true;
}